

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevolute::IntToDescriptor
          (ChLinkRevolute *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  int iVar1;
  CoeffReturnType pdVar2;
  undefined4 in_register_00000034;
  
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (this,CONCAT44(in_register_00000034,off_v));
  if ((char)iVar1 != '\0') {
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,(ulong)off_L
                       );
    (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 1));
    (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 2));
    (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 3));
    (this->m_cnstr_uw).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 4));
    (this->m_cnstr_vw).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                        (ulong)off_L);
    (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                        (ulong)(off_L + 1));
    (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                        (ulong)(off_L + 2));
    (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                        (ulong)(off_L + 3));
    (this->m_cnstr_uw).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                        (ulong)(off_L + 4));
    (this->m_cnstr_vw).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
  }
  return;
}

Assistant:

void ChLinkRevolute::IntToDescriptor(const unsigned int off_v,
                                     const ChStateDelta& v,
                                     const ChVectorDynamic<>& R,
                                     const unsigned int off_L,
                                     const ChVectorDynamic<>& L,
                                     const ChVectorDynamic<>& Qc) {
    if (!IsActive())
        return;

    m_cnstr_x.Set_l_i(L(off_L + 0));
    m_cnstr_y.Set_l_i(L(off_L + 1));
    m_cnstr_z.Set_l_i(L(off_L + 2));
    m_cnstr_uw.Set_l_i(L(off_L + 3));
    m_cnstr_vw.Set_l_i(L(off_L + 4));

    m_cnstr_x.Set_b_i(Qc(off_L + 0));
    m_cnstr_y.Set_b_i(Qc(off_L + 1));
    m_cnstr_z.Set_b_i(Qc(off_L + 2));
    m_cnstr_uw.Set_b_i(Qc(off_L + 3));
    m_cnstr_vw.Set_b_i(Qc(off_L + 4));
}